

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
           *this,duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  function<void_()> local_60;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  undefined1 local_30 [16];
  timer_action *action_local;
  basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
  *this_local;
  duration<long,_std::ratio<1L,_1000000000L>_> period_local;
  duration<long,_std::ratio<1L,_1000000000L>_> pause_local;
  
  local_30._8_8_ = action;
  action_local = (timer_action *)this;
  this_local = (basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                *)period.__r;
  period_local = pause;
  basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
  ::allocate((basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
              *)local_30);
  local_38.__r = period_local.__r;
  local_40.__r = (rep)this_local;
  std::function<void_()>::function(&local_60,action);
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this,(timer_holder *)local_30,local_38,local_40,&local_60);
  std::function<void_()>::~function(&local_60);
  timer_object_holder<timertt::thread_safety::safe>::~timer_object_holder
            ((timer_object_holder<timertt::thread_safety::safe> *)local_30);
  return;
}

Assistant:

void
	activate(
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		activate( allocate(), pause, period, std::move( action ) );
	}